

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O1

void __thiscall avro::ArraySchema::ArraySchema(ArraySchema *this,Schema *itemsSchema)

{
  Node *pNVar1;
  
  pNVar1 = (Node *)operator_new(0x28);
  pNVar1->type_ = AVRO_ARRAY;
  pNVar1->locked_ = false;
  pNVar1[1]._vptr_Node = (_func_int **)0x0;
  pNVar1[1].type_ = AVRO_STRING;
  pNVar1[1].locked_ = false;
  *(undefined3 *)&pNVar1[1].field_0xd = 0;
  pNVar1->_vptr_Node = (_func_int **)&PTR__NodeImpl_001cec90;
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001cf048;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::Node>(&(this->super_Schema).node_,pNVar1);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001cf0b8;
  pNVar1 = (this->super_Schema).node_.px;
  Node::checkLock(pNVar1);
  (*pNVar1->_vptr_Node[0x12])(pNVar1,&itemsSchema->node_);
  return;
}

Assistant:

ArraySchema::ArraySchema(const Schema &itemsSchema) :
    Schema(new NodeArray)
{
    node_->addLeaf(itemsSchema.root());
}